

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O0

void __thiscall Simulator::memoryAccess(Simulator *this)

{
  undefined4 uVar1;
  uint uVar2;
  uint8_t **ppuVar3;
  byte bVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  uint32_t *cycles_00;
  uint8_t **ppuVar7;
  MemoryManager *in_RDI;
  uint32_t cycles;
  int64_t valM;
  InstSet inst;
  uint64_t pc;
  uint32_t rd;
  int64_t val2;
  int64_t valE;
  uint32_t func;
  uint32_t opcode;
  uint32_t *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffb8;
  int iVar8;
  uint8_t **ppuVar9;
  uint8_t **cycles_01;
  uint uVar10;
  uint val;
  
  val = *(uint *)(in_RDI->memory + 0x1f);
  uVar10 = *(uint *)((long)in_RDI->memory + 0xfc);
  ppuVar7 = in_RDI->memory[0x22];
  cycles_01 = in_RDI->memory[0x21];
  uVar1 = *(undefined4 *)(in_RDI->memory + 0x20);
  ppuVar3 = in_RDI->memory[0x23];
  uVar2 = *(uint *)(in_RDI->memory + 0x24);
  if ((*(byte *)((long)in_RDI->memory + 0x1f9) & 1) != 0) {
    printf("\tMA: %s ",*(undefined8 *)(RISCV_GRX::INSTNAME + (ulong)uVar2 * 8));
  }
  ppuVar9 = (uint8_t **)0x0;
  iVar8 = 0;
  cycles_00 = (uint32_t *)(ulong)val;
  uVar6 = (uint32_t)((ulong)in_RDI >> 0x20);
  switch(cycles_00) {
  case (uint32_t *)0x0:
  case (uint32_t *)0x13:
  case (uint32_t *)0x17:
  case (uint32_t *)0x1b:
  case (uint32_t *)0x33:
  case (uint32_t *)0x37:
  case (uint32_t *)0x3b:
  case (uint32_t *)0x63:
  case (uint32_t *)0x67:
  case (uint32_t *)0x6f:
  case (uint32_t *)0x73:
    break;
  default:
    raiseError((Simulator *)in_RDI,"Invaild Instruction at %x\n",ppuVar3);
    break;
  case (uint32_t *)0x3:
    *(int *)((long)in_RDI->memory + 0x1ac) = *(int *)((long)in_RDI->memory + 0x1ac) + 1;
    switch((uint32_t *)(ulong)uVar10) {
    case (uint32_t *)0x0:
      bVar4 = MemoryManager::getByte
                        ((MemoryManager *)(ulong)in_stack_ffffffffffffffb8,uVar6,cycles_00);
      ppuVar9 = (uint8_t **)(ulong)bVar4;
      break;
    case (uint32_t *)0x1:
      uVar5 = MemoryManager::getShort(in_RDI,0,(uint32_t *)(ulong)uVar10);
      ppuVar9 = (uint8_t **)(ulong)uVar5;
      break;
    case (uint32_t *)0x2:
      uVar6 = MemoryManager::getInt((MemoryManager *)0x0,0,(uint32_t *)in_RDI);
      ppuVar9 = (uint8_t **)(ulong)uVar6;
      break;
    case (uint32_t *)0x3:
      ppuVar9 = (uint8_t **)
                MemoryManager::getLong
                          ((MemoryManager *)CONCAT44(val,uVar10),(uint32_t)((ulong)ppuVar7 >> 0x20),
                           (uint32_t *)cycles_01);
      break;
    case (uint32_t *)0x4:
      bVar4 = MemoryManager::getByte
                        ((MemoryManager *)(ulong)in_stack_ffffffffffffffb8,uVar6,cycles_00);
      ppuVar9 = (uint8_t **)(ulong)bVar4;
      break;
    case (uint32_t *)0x5:
      uVar6 = MemoryManager::getInt((MemoryManager *)0x0,0,(uint32_t *)in_RDI);
      ppuVar9 = (uint8_t **)(ulong)uVar6;
      break;
    case (uint32_t *)0x6:
      uVar6 = MemoryManager::getInt((MemoryManager *)0x0,0,(uint32_t *)in_RDI);
      ppuVar7 = (uint8_t **)(ulong)uVar6;
      break;
    default:
      raiseError((Simulator *)in_RDI,
                 "Invaild LOAD Instruction at %x, The Func Field %x is invaild\n",ppuVar3,
                 (ulong)uVar10);
    }
    break;
  case (uint32_t *)0x23:
    *(int *)(in_RDI->memory + 0x36) = *(int *)(in_RDI->memory + 0x36) + 1;
    switch((uint32_t *)(ulong)uVar10) {
    case (uint32_t *)0x0:
      MemoryManager::setByte
                ((MemoryManager *)(ulong)in_stack_ffffffffffffffb8,uVar6,
                 (uint8_t)((ulong)in_RDI >> 0x18),cycles_00);
      break;
    case (uint32_t *)0x1:
      MemoryManager::setShort(in_RDI,0,(uint16_t)(val >> 0x10),in_stack_ffffffffffffffa0);
      break;
    case (uint32_t *)0x2:
      MemoryManager::setInt(in_RDI,0,val,in_stack_ffffffffffffffa0);
      break;
    case (uint32_t *)0x3:
      MemoryManager::setLong(in_RDI,0,(uint64_t)in_stack_ffffffffffffffa0,(uint32_t *)(ulong)uVar10)
      ;
      break;
    default:
      raiseError((Simulator *)in_RDI,
                 "Invaild READ Instruction at %x, The Func Field %x is invaild\n",ppuVar3,
                 (ulong)uVar10);
    }
  }
  *(int *)((long)in_RDI->memory + 0x19c) = iVar8 + *(int *)((long)in_RDI->memory + 0x19c);
  *(uint *)(in_RDI->memory + 0x26) = val;
  *(undefined4 *)((long)in_RDI->memory + 0x134) = uVar1;
  in_RDI->memory[0x27] = ppuVar7;
  in_RDI->memory[0x28] = ppuVar9;
  *(uint *)(in_RDI->memory + 0x29) = uVar2;
  in_RDI->memory[0x32] = ppuVar9;
  return;
}

Assistant:

void Simulator::memoryAccess() {
    uint32_t opcode = m_reg.out.opcode;
    uint32_t func = m_reg.out.func;
    int64_t valE = m_reg.out.valE;
    int64_t val2 = m_reg.out.val2;
    uint32_t rd = m_reg.out.rd;
    uint64_t pc = m_reg.out.pc;
    InstSet inst = m_reg.out.inst;
    if (is_verbose) {
        printf("\tMA: %s ", INSTNAME[inst]);
    }
    int64_t valM = 0;
    uint32_t cycles = 0;

    switch (opcode) {
        case OP_LOAD: {
            history.load_count++;
            switch (func) {
                case 0x0:
                    valM = (int64_t) memory->getByte(valE, &cycles);
                    break;
                case 0x1:
                    valM = (int64_t) memory->getShort(valE, &cycles);
                    break;
                case 0x2:
                    valM = (int64_t) memory->getInt(valE, &cycles);
                    break;
                case 0x3:
                    valM = (int64_t) memory->getLong(valE, &cycles);
                    break;
                case 0x4:
                    valM = (uint64_t) memory->getByte(valE, &cycles);
                    break;
                case 0x5:
                    valM = (uint64_t) memory->getInt(valE, &cycles);
                    break;
                case 0x6:
                    valE = (uint64_t) memory->getInt(valE, &cycles);
                    break;
                default:
                    this->raiseError("Invaild LOAD Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
//            cycles = 100;
            break;
        }
        case OP_STORE:
            history.store_count++;
            switch (func) {
                case 0x0:
                    memory->setByte(valE, val2, &cycles);
                    break;
                case 0x1:
                    memory->setShort(valE, val2, &cycles);
                    break;
                case 0x2:
                    memory->setInt(valE, val2, &cycles);
                    break;
                case 0x3:
                    memory->setLong(valE, val2, &cycles);
                    break;
                default:
                    this->raiseError("Invaild READ Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
//            cycles = 100;
            break;

        case OP_RR:
        case OP_32:
        case OP_IMM:
        case OP_IMM_32:
        case OP_BRANCH:
        case OP_JAL:
        case OP_JALR:
        case OP_LUI:
        case OP_AUIPC:
        case OP_ECALL:

        case OP_BUBBLE:
            break;
        default:
            this->raiseError("Invaild Instruction at %x\n", pc);
            break;
    }

    this->history.cycle_count += cycles;

    w_reg.in.opcode = opcode;
    w_reg.in.rd = rd;
    w_reg.in.valE = valE;
    w_reg.in.valM = valM;
    w_reg.in.inst = inst;

    bypass.m_valM = valM;

}